

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_share_context(REF_GEOM ref_geom_recipient,REF_GEOM ref_geom_donor)

{
  uint uVar1;
  REF_INT *pRVar2;
  bool bVar3;
  REF_INT *pRVar4;
  ulong uVar5;
  uint unaff_EBX;
  ulong uVar6;
  char *pcVar7;
  
  if ((ref_geom_recipient->contex_owned != 0) &&
     (unaff_EBX = ref_egads_close(ref_geom_recipient), unaff_EBX != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xbd,
           "ref_geom_share_context",(ulong)unaff_EBX,"close egads contex");
    return unaff_EBX;
  }
  ref_geom_recipient->contex_owned = 0;
  ref_geom_recipient->nnode = ref_geom_donor->nnode;
  uVar1 = ref_geom_donor->nedge;
  ref_geom_recipient->nedge = uVar1;
  ref_geom_recipient->nface = ref_geom_donor->nface;
  ref_geom_recipient->effective = ref_geom_donor->effective;
  ref_geom_recipient->effective_curvature = ref_geom_donor->effective_curvature;
  ref_geom_recipient->manifold = ref_geom_donor->manifold;
  ref_geom_recipient->context = ref_geom_donor->context;
  ref_geom_recipient->model = ref_geom_donor->model;
  ref_geom_recipient->body = ref_geom_donor->body;
  ref_geom_recipient->faces = ref_geom_donor->faces;
  ref_geom_recipient->edges = ref_geom_donor->edges;
  ref_geom_recipient->nodes = ref_geom_donor->nodes;
  ref_geom_recipient->pcurves = ref_geom_donor->pcurves;
  if (ref_geom_donor->e2f == (REF_INT *)0x0) {
    ref_geom_recipient->e2f = (REF_INT *)0x0;
    return 0;
  }
  if ((int)uVar1 < 0) {
    unaff_EBX = 1;
    pcVar7 = "malloc ref_geom_recipient->e2f of REF_INT negative";
  }
  else {
    pRVar4 = (REF_INT *)malloc((ulong)uVar1 << 3);
    ref_geom_recipient->e2f = pRVar4;
    if (pRVar4 != (REF_INT *)0x0) {
      bVar3 = true;
      if (0 < ref_geom_recipient->nedge) {
        uVar1 = ref_geom_recipient->nedge * 2;
        pRVar2 = ref_geom_donor->e2f;
        uVar5 = 1;
        if (1 < (int)uVar1) {
          uVar5 = (ulong)uVar1;
        }
        uVar6 = 0;
        do {
          pRVar4[uVar6] = pRVar2[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      goto LAB_0019ac0b;
    }
    unaff_EBX = 2;
    pcVar7 = "malloc ref_geom_recipient->e2f of REF_INT NULL";
  }
  bVar3 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xd2,
         "ref_geom_share_context",pcVar7);
LAB_0019ac0b:
  if (bVar3) {
    return 0;
  }
  return unaff_EBX;
}

Assistant:

REF_FCN REF_STATUS ref_geom_share_context(REF_GEOM ref_geom_recipient,
                                          REF_GEOM ref_geom_donor) {
  if (ref_geom_recipient->contex_owned)
    RSS(ref_egads_close(ref_geom_recipient), "close egads contex");

  ref_geom_recipient->contex_owned = REF_FALSE;
  ref_geom_recipient->nnode = ref_geom_donor->nnode;
  ref_geom_recipient->nedge = ref_geom_donor->nedge;
  ref_geom_recipient->nface = ref_geom_donor->nface;
  ref_geom_recipient->effective = ref_geom_donor->effective;
  ref_geom_recipient->effective_curvature = ref_geom_donor->effective_curvature;
  ref_geom_recipient->manifold = ref_geom_donor->manifold;
  ref_geom_recipient->context = ref_geom_donor->context;
  ref_geom_recipient->model = ref_geom_donor->model;
  ref_geom_recipient->body = ref_geom_donor->body;
  ref_geom_recipient->faces = ref_geom_donor->faces;
  ref_geom_recipient->edges = ref_geom_donor->edges;
  ref_geom_recipient->nodes = ref_geom_donor->nodes;
  ref_geom_recipient->pcurves = ref_geom_donor->pcurves;

  if (NULL == ref_geom_donor->e2f) {
    ref_geom_recipient->e2f = NULL;
  } else {
    REF_INT i;
    ref_malloc(ref_geom_recipient->e2f, 2 * ref_geom_recipient->nedge, REF_INT);
    for (i = 0; i < 2 * ref_geom_recipient->nedge; i++)
      ref_geom_recipient->e2f[i] = ref_geom_donor->e2f[i];
  }

  return REF_SUCCESS;
}